

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall
chrono::ChSystem::StateScatter(ChSystem *this,ChState *x,ChStateDelta *v,double T,bool full_update)

{
  element_type *peVar1;
  undefined7 in_register_00000009;
  
  ChAssembly::IntStateScatter(&this->assembly,0,x,0,v,T,full_update);
  peVar1 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1c])
            (T,peVar1,(ulong)((peVar1->super_ChPhysicsItem).offset_x -
                             (this->assembly).super_ChPhysicsItem.offset_x),x,
             (ulong)((peVar1->super_ChPhysicsItem).offset_w -
                    (this->assembly).super_ChPhysicsItem.offset_w),v,
             CONCAT71(in_register_00000009,full_update) & 0xffffffff);
  this->ch_time = T;
  return;
}

Assistant:

void ChSystem::StateScatter(const ChState& x, const ChStateDelta& v, const double T, bool full_update) {
    unsigned int off_x = 0;
    unsigned int off_v = 0;

    // Let each object (bodies, links, etc.) in the assembly extract its own states.
    // Note that each object also performs an update
    assembly.IntStateScatter(off_x, x, off_v, v, T, full_update);

    // Use also on contact container:
    unsigned int displ_x = off_x - assembly.offset_x;
    unsigned int displ_v = off_v - assembly.offset_w;
    contact_container->IntStateScatter(displ_x + contact_container->GetOffset_x(), x,  //
                                       displ_v + contact_container->GetOffset_w(), v,  //
                                       T, full_update);

    ch_time = T;
}